

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_svg_1.0.0.hpp
# Opt level: O2

void __thiscall svg::Document::writeToStream(Document *this,ostream *str)

{
  pointer pbVar1;
  ostream *poVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *body_node_str;
  pointer pbVar3;
  allocator local_264;
  allocator local_263;
  allocator local_262;
  allocator local_261;
  allocator local_260;
  allocator local_25f;
  allocator local_25e;
  allocator local_25d;
  allocator local_25c;
  allocator local_25b;
  allocator local_25a;
  allocator local_259;
  string local_258;
  string local_238;
  string local_218;
  string local_1f8;
  string local_1d8;
  string local_1b8;
  string local_198;
  string local_178;
  string local_158;
  string local_138;
  string local_118;
  string local_f8;
  string local_d8;
  string local_b8;
  string local_98;
  string local_78;
  string local_58;
  string local_38;
  
  poVar2 = std::operator<<(str,"<?xml ");
  std::__cxx11::string::string((string *)&local_258,"version",&local_259);
  std::__cxx11::string::string((string *)&local_218,"",&local_25a);
  attribute<char[4]>(&local_238,&local_258,(char (*) [4])"1.0",&local_218);
  poVar2 = std::operator<<(poVar2,(string *)&local_238);
  std::__cxx11::string::string((string *)&local_58,"standalone",&local_25b);
  std::__cxx11::string::string((string *)&local_78,"",&local_25c);
  attribute<char[3]>(&local_38,&local_58,(char (*) [3])"no",&local_78);
  poVar2 = std::operator<<(poVar2,(string *)&local_38);
  poVar2 = std::operator<<(poVar2,"?>\n<!DOCTYPE svg PUBLIC \"-//W3C//DTD SVG 1.1//EN\" ");
  poVar2 = std::operator<<(poVar2,"\"http://www.w3.org/Graphics/SVG/1.1/DTD/svg11.dtd\">\n<svg ");
  std::__cxx11::string::string((string *)&local_b8,"width",&local_25d);
  std::__cxx11::string::string((string *)&local_d8,"px",&local_25e);
  attribute<double>(&local_98,&local_b8,(double *)&this->layout,&local_d8);
  poVar2 = std::operator<<(poVar2,(string *)&local_98);
  std::__cxx11::string::string((string *)&local_118,"height",&local_25f);
  std::__cxx11::string::string((string *)&local_138,"px",&local_260);
  attribute<double>(&local_f8,&local_118,&(this->layout).dimensions.height,&local_138);
  poVar2 = std::operator<<(poVar2,(string *)&local_f8);
  std::__cxx11::string::string((string *)&local_178,"xmlns",&local_261);
  std::__cxx11::string::string((string *)&local_198,"",&local_262);
  attribute<char[27]>(&local_158,&local_178,(char (*) [27])"http://www.w3.org/2000/svg",&local_198);
  poVar2 = std::operator<<(poVar2,(string *)&local_158);
  std::__cxx11::string::string((string *)&local_1d8,"version",&local_263);
  std::__cxx11::string::string((string *)&local_1f8,"",&local_264);
  attribute<char[4]>(&local_1b8,&local_1d8,(char (*) [4])"1.1",&local_1f8);
  poVar2 = std::operator<<(poVar2,(string *)&local_1b8);
  std::operator<<(poVar2,">\n");
  std::__cxx11::string::~string((string *)&local_1b8);
  std::__cxx11::string::~string((string *)&local_1f8);
  std::__cxx11::string::~string((string *)&local_1d8);
  std::__cxx11::string::~string((string *)&local_158);
  std::__cxx11::string::~string((string *)&local_198);
  std::__cxx11::string::~string((string *)&local_178);
  std::__cxx11::string::~string((string *)&local_f8);
  std::__cxx11::string::~string((string *)&local_138);
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_238);
  std::__cxx11::string::~string((string *)&local_218);
  std::__cxx11::string::~string((string *)&local_258);
  pbVar1 = (this->body_nodes_str_list).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pbVar3 = (this->body_nodes_str_list).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pbVar3 != pbVar1; pbVar3 = pbVar3 + 1) {
    std::operator<<(str,(string *)pbVar3);
  }
  std::__cxx11::string::string((string *)&local_258,"svg",(allocator *)&local_218);
  elemEnd(&local_238,&local_258);
  std::operator<<(str,(string *)&local_238);
  std::__cxx11::string::~string((string *)&local_238);
  std::__cxx11::string::~string((string *)&local_258);
  return;
}

Assistant:

void writeToStream(std::ostream& str) const
        {
            str << "<?xml " << attribute("version", "1.0") << attribute("standalone", "no")
                << "?>\n<!DOCTYPE svg PUBLIC \"-//W3C//DTD SVG 1.1//EN\" "
                << "\"http://www.w3.org/Graphics/SVG/1.1/DTD/svg11.dtd\">\n<svg "
                << attribute("width", layout.dimensions.width, "px")
                << attribute("height", layout.dimensions.height, "px")
                << attribute("xmlns", "http://www.w3.org/2000/svg")
                << attribute("version", "1.1") << ">\n";
            for (const auto& body_node_str : body_nodes_str_list) {
                str << body_node_str;
            }
            str << elemEnd("svg");
        }